

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  bool bVar1;
  uint uVar2;
  int v1;
  int v2;
  LogMessage *pLVar3;
  int local_74;
  void *pvStack_70;
  int out_size;
  void *out;
  undefined1 local_58 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  string *local_30;
  string *absl_log_internal_check_op_result;
  void *pvStack_20;
  int size_local;
  void *data_local;
  CopyingOutputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result._4_4_ = size;
  pvStack_20 = data;
  data_local = this;
  if (size < this->buffer_size_) {
    while (uVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                             (this,&stack0xffffffffffffff90,&local_74), (uVar2 & 1) != 0) {
      if ((int)absl_log_internal_check_op_result._4_4_ <= local_74) {
        memcpy(pvStack_70,pvStack_20,(long)(int)absl_log_internal_check_op_result._4_4_);
        (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                  (this,(ulong)(local_74 - absl_log_internal_check_op_result._4_4_));
        return true;
      }
      memcpy(pvStack_70,pvStack_20,(long)local_74);
      pvStack_20 = (void *)((long)pvStack_20 + (long)local_74);
      absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ - local_74;
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Flush(this);
    if ((bVar1) &&
       (uVar2 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,pvStack_20,
                           (ulong)absl_log_internal_check_op_result._4_4_), (uVar2 & 1) != 0)) {
      v1 = absl::lts_20240722::log_internal::GetReferenceableValue(this->buffer_used_);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_30 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (v1,v2,"buffer_used_ == 0");
      if (local_30 != (string *)0x0) {
        local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0x14f,local_58._0_8_,local_58._8_8_);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_48);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
      }
      this->position_ = (long)(int)absl_log_internal_check_op_result._4_4_ + this->position_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}